

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_cell_query_base.h
# Opt level: O0

void __thiscall
S2ClosestCellQueryBase<S2MinDistance>::S2ClosestCellQueryBase
          (S2ClosestCellQueryBase<S2MinDistance> *this)

{
  S2CellId _cell_id;
  LabelledCell local_2c;
  allocator<S2CellIndex::LabelledCell> local_1f;
  key_equal local_1e;
  hasher local_1d [13];
  S2ClosestCellQueryBase<S2MinDistance> *local_10;
  S2ClosestCellQueryBase<S2MinDistance> *this_local;
  
  local_10 = this;
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector(&this->index_covering_);
  S2MinDistance::S2MinDistance(&this->distance_limit_);
  Result::Result(&this->result_singleton_);
  std::
  vector<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>_>
  ::vector(&this->result_vector_);
  gtl::
  btree_set<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256>
  ::btree_set(&this->result_set_);
  std::allocator<S2CellIndex::LabelledCell>::allocator(&local_1f);
  gtl::
  dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
  ::dense_hash_set(&this->tested_cells_,1,local_1d,&local_1e,&local_1f);
  std::allocator<S2CellIndex::LabelledCell>::~allocator(&local_1f);
  std::
  priority_queue<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry,absl::InlinedVector<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry,16ul,std::allocator<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry>>,std::less<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry>>
  ::
  priority_queue<absl::InlinedVector<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry,16ul,std::allocator<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry>>,void>
            ((priority_queue<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry,absl::InlinedVector<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry,16ul,std::allocator<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry>>,std::less<S2ClosestCellQueryBase<S2MinDistance>::QueueEntry>>
              *)&this->queue_);
  S2CellIndex::ContentsIterator::ContentsIterator(&this->contents_it_);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector(&this->max_distance_covering_);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector(&this->intersection_with_max_distance_);
  _cell_id = S2CellId::None();
  S2CellIndex::LabelledCell::LabelledCell(&local_2c,_cell_id,-1);
  gtl::
  dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
  ::set_empty_key(&this->tested_cells_,&local_2c);
  return;
}

Assistant:

S2ClosestCellQueryBase<Distance>::S2ClosestCellQueryBase()
    : tested_cells_(1) /* expected_max_elements*/ {
  tested_cells_.set_empty_key(LabelledCell(S2CellId::None(), -1));
}